

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<int>::AddKel(TPZMatrix<int> *this,TPZFMatrix<int> *elmat,TPZVec<long> *destinationindex)

{
  int iVar1;
  int64_t iVar2;
  long *plVar3;
  int *piVar4;
  TPZVec<long> *in_RDX;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int prevval_1;
  int prevval;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  int local_48;
  int local_44;
  long lVar5;
  long lVar6;
  TPZFMatrix<int> *pTVar7;
  TPZFMatrix<int> *local_28;
  
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  iVar1 = (**(code **)(*in_RDI + 0x80))();
  if (iVar1 == 0) {
    for (local_28 = (TPZFMatrix<int> *)0x0; (long)local_28 < iVar2;
        local_28 = (TPZFMatrix<int> *)((long)local_28 + 1)) {
      plVar3 = TPZVec<long>::operator[](in_RDX,(int64_t)local_28);
      lVar6 = *plVar3;
      for (pTVar7 = (TPZFMatrix<int> *)0x0; (long)pTVar7 < iVar2;
          pTVar7 = (TPZFMatrix<int> *)
                   ((long)&(pTVar7->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                           _vptr_TPZSavable + 1)) {
        plVar3 = TPZVec<long>::operator[](in_RDX,(int64_t)pTVar7);
        lVar5 = *plVar3;
        local_48 = (**(code **)(*in_RDI + 0x120))(in_RDI,lVar6,lVar5);
        piVar4 = TPZFMatrix<int>::operator()(pTVar7,lVar6,lVar5);
        local_48 = *piVar4 + local_48;
        (**(code **)(*in_RDI + 0x118))(in_RDI,lVar6,lVar5,&local_48);
      }
    }
  }
  else {
    for (local_28 = (TPZFMatrix<int> *)0x0; (long)local_28 < iVar2;
        local_28 = (TPZFMatrix<int> *)
                   ((long)&(local_28->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                           _vptr_TPZSavable + 1)) {
      plVar3 = TPZVec<long>::operator[](in_RDX,(int64_t)local_28);
      lVar6 = *plVar3;
      for (pTVar7 = local_28; (long)pTVar7 < iVar2;
          pTVar7 = (TPZFMatrix<int> *)
                   ((long)&(pTVar7->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                           _vptr_TPZSavable + 1)) {
        plVar3 = TPZVec<long>::operator[](in_RDX,(int64_t)pTVar7);
        lVar5 = *plVar3;
        local_44 = (**(code **)(*in_RDI + 0x120))(in_RDI,lVar6,lVar5);
        piVar4 = TPZFMatrix<int>::operator()(pTVar7,lVar6,lVar5);
        local_44 = *piVar4 + local_44;
        (**(code **)(*in_RDI + 0x118))(in_RDI,lVar6,lVar5,&local_44);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}